

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

char * ImGui::GetKeyName(ImGuiKey key)

{
  bool bVar1;
  ImGuiIO *pIVar2;
  ImGuiIO *io;
  char *pcStack_10;
  ImGuiKey key_local;
  
  bVar1 = IsLegacyKey(key);
  io._4_4_ = key;
  if (bVar1) {
    pIVar2 = GetIO();
    if (pIVar2->KeyMap[key] == -1) {
      pcStack_10 = "N/A";
      return pcStack_10;
    }
    bVar1 = IsNamedKey(pIVar2->KeyMap[key]);
    if (!bVar1) {
      __assert_fail("IsNamedKey((ImGuiKey)io.KeyMap[key])",
                    "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui.cpp"
                    ,0x1d84,"const char *ImGui::GetKeyName(ImGuiKey)");
    }
    io._4_4_ = pIVar2->KeyMap[key];
  }
  if (io._4_4_ == 0) {
    pcStack_10 = "None";
  }
  else {
    bVar1 = IsNamedKey(io._4_4_);
    if (bVar1) {
      pcStack_10 = GKeyNames[io._4_4_ + -0x200];
    }
    else {
      pcStack_10 = "Unknown";
    }
  }
  return pcStack_10;
}

Assistant:

const char* ImGui::GetKeyName(ImGuiKey key)
{
#ifdef IMGUI_DISABLE_OBSOLETE_KEYIO
    IM_ASSERT((IsNamedKey(key) || key == ImGuiKey_None) && "Support for user key indices was dropped in favor of ImGuiKey. Please update backend and user code.");
#else
    if (IsLegacyKey(key))
    {
        ImGuiIO& io = GetIO();
        if (io.KeyMap[key] == -1)
            return "N/A";
        IM_ASSERT(IsNamedKey((ImGuiKey)io.KeyMap[key]));
        key = (ImGuiKey)io.KeyMap[key];
    }
#endif
    if (key == ImGuiKey_None)
        return "None";
    if (!IsNamedKey(key))
        return "Unknown";

    return GKeyNames[key - ImGuiKey_NamedKey_BEGIN];
}